

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void error<Token,Token>(char *fmtstr,Token *args,Token *args_1)

{
  String local_60;
  String local_40;
  Token *local_20;
  Token *args_local_1;
  Token *args_local;
  char *fmtstr_local;
  
  local_20 = args_1;
  args_local_1 = args;
  args_local = (Token *)fmtstr;
  String::String(&local_60,fmtstr);
  format<Token,Token>(&local_40,&local_60,args_local_1,local_20);
  error(&local_40);
  String::~String(&local_40);
  String::~String(&local_60);
  return;
}

Assistant:

void error (const char* fmtstr, const argtypes&... args)
{
	error (format (String (fmtstr), args...));
}